

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TgNextPermutation(Abc_TgMan_t *pMan)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  if (0 < pMan->nGroups) {
    lVar10 = 0;
    do {
      cVar1 = pMan->pGroup[lVar10].nGVars;
      uVar11 = (uint)cVar1;
      if (uVar11 != 1) {
        lVar7 = (long)pMan->pGroup[lVar10].iStart;
        lVar2 = lVar7 + 0x1c;
        pcVar8 = pMan->pPermDir + lVar7;
        uVar9 = (ulong)uVar11;
        uVar3 = 0xffffffff;
        if ('\0' < cVar1) {
          uVar5 = 0;
          do {
            uVar6 = (int)pcVar8[uVar5] + (uint)uVar5;
            if (((uVar6 < uVar11) &&
                (pMan->pPerm[(ulong)uVar6 + lVar2 + -0x1c] < pcVar8[uVar5 - 0x30])) &&
               (((int)uVar3 < 0 ||
                (pMan->pPerm[(ulong)uVar3 + lVar2 + -0x1c] < pcVar8[uVar5 - 0x30])))) {
              uVar3 = (uint)uVar5;
            }
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        if ('\0' < cVar1) {
          uVar5 = 0;
          do {
            if (pMan->pPerm[(ulong)uVar3 + lVar2 + -0x1c] < pcVar8[uVar5 - 0x30]) {
              pcVar8[uVar5] = -pcVar8[uVar5];
            }
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        }
        uVar11 = (int)pcVar8[uVar3] + uVar3;
        if (-1 < (int)uVar11) {
          if ((int)uVar11 < (int)uVar3) {
            uVar3 = uVar11;
          }
          Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar10].iStart + uVar3);
          return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar10].iStart);
        if (*pcVar8 != -1) {
LAB_005027e9:
          __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0x8b8,"int Abc_TgNextPermutation(Abc_TgMan_t *)");
        }
        if ('\x01' < cVar1) {
          lVar4 = 0;
          do {
            if ((pMan->pPermDir[lVar4 + lVar7 + 1] != -1) ||
               (pMan->pPerm[lVar4 + lVar7 + 1] < pMan->pPerm[lVar4 + lVar2 + -0x1c]))
            goto LAB_005027e9;
            lVar4 = lVar4 + 1;
          } while (uVar9 - 1 != lVar4);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pMan->nGroups);
  }
  return 0;
}

Assistant:

static int Abc_TgNextPermutation(Abc_TgMan_t * pMan)
{
    int i, j, nGvars;
    TiedGroup * pGrp;
    char * pVars;
    signed char * pDirs;
    for (i = 0; i < pMan->nGroups; i++)
    {
        pGrp = pMan->pGroup + i;
        nGvars = pGrp->nGVars;
        if (nGvars == 1) continue;
        pVars = pMan->pPerm + pGrp->iStart;
        pDirs = pMan->pPermDir + pGrp->iStart;
        j = Abc_NextPermSwapC(pVars, pDirs, nGvars);
        if (j >= 0)
        {
            Abc_TgSwapAdjacentSymGroups(pMan, j + pGrp->iStart);
            return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan, pGrp->iStart);
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
    return 0;
}